

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoarimatest2.c
# Opt level: O2

int main(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *inp;
  auto_arima_object obj;
  long lVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dStack_25d8;
  double temp [1200];
  int order [3];
  int seasonal [3];
  
  temp[0x4af] = 4.24399158440087e-314;
  order[0] = 5;
  order[1] = 2;
  order[2] = 1;
  xpred = (double *)malloc(0);
  amse = (double *)malloc(0);
  __stream = fopen("../data/seriesG.txt","r");
  if (__stream != (FILE *)0x0) {
    uVar3 = 0;
    lVar4 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf\n",(long)temp + (uVar3 - 8));
      lVar4 = lVar4 + 1;
      uVar3 = uVar3 + 8;
    }
    inp = (double *)malloc(uVar3 & 0x7fffffff8);
    for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      dVar5 = log(temp[lVar2 + -1]);
      inp[lVar2] = dVar5;
    }
    obj = auto_arima_init((int *)(temp + 0x4af),order + 1,0xc,0,(int)lVar4);
    auto_arima_setApproximation(obj,1);
    auto_arima_setStepwise(obj,1);
    auto_arima_setVerbose(obj,1);
    auto_arima_exec(obj,inp,(double *)0x0);
    auto_arima_summary(obj);
    auto_arima_predict(obj,inp,(double *)0x0,0,(double *)0x0,xpred,amse);
    puts("\n\n");
    printf("Forecast : 5 Point Look Ahead");
    putchar(10);
    printf("Predicted Values : ");
    putchar(10);
    printf("Standard Errors  : ");
    putchar(10);
    auto_arima_free(obj);
    free(inp);
    free(xpred);
    free(amse);
    fclose(__stream);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
    int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	s = 12;
	P = 2;
	D = 1;
	Q = 2;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf\n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		inp[i] = log(temp[i]);   
	}


	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,1);
	auto_arima_setStepwise(obj,1);
	auto_arima_setVerbose(obj,1);

	auto_arima_exec(obj,inp,NULL);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, NULL, L,NULL, xpred, amse);

	printf("\n\n\n");
	printf("Forecast : 5 Point Look Ahead");
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", exp(sqrt(amse[i])));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
	fclose(ifp);

    return 0;
}